

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::setOrder(ConfigData *config,string *order)

{
  bool bVar1;
  runtime_error *this;
  char local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *order_local;
  ConfigData *config_local;
  
  local_18 = order;
  order_local = (string *)config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"declared",&local_39);
  bVar1 = startsWith((string *)local_38,local_18);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (bVar1) {
    *(undefined4 *)(order_local + 0x20) = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"lexical",&local_71);
    bVar1 = startsWith((string *)local_70,local_18);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    if (bVar1) {
      *(undefined4 *)(order_local + 0x20) = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"random",&local_99);
      bVar1 = startsWith((string *)local_98,local_18);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      if (!bVar1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )"Unrecognised ordering: \'");
        std::operator+(local_c0,local_e0);
        std::runtime_error::runtime_error(this,(string *)local_c0);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *(undefined4 *)(order_local + 0x20) = 2;
    }
  }
  return;
}

Assistant:

inline void setOrder(ConfigData& config, std::string const& order) {
		if (startsWith("declared", order))
			config.runOrder = RunTests::InDeclarationOrder;
		else if (startsWith("lexical", order))
			config.runOrder = RunTests::InLexicographicalOrder;
		else if (startsWith("random", order))
			config.runOrder = RunTests::InRandomOrder;
		else
			throw std::runtime_error("Unrecognised ordering: '" + order + "'");
	}